

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

void __thiscall dgMeshEffect::SphericalMapping(dgMeshEffect *this,HaI32 material)

{
  int iVar1;
  dgTreeNode *this_00;
  dgRedBackNode *pdVar2;
  dgBigVector *pdVar3;
  dgVertexAtribute *pdVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  dgStack<dgMeshEffect::dgVertexAtribute> attribArray;
  dgStack<dgBigVector> sphere;
  Iterator iter;
  dgBigVector origin;
  dgStack<dgMeshEffect::dgVertexAtribute> local_a8;
  double local_98;
  HaI32 local_8c;
  dgStack<dgBigVector> local_88;
  double local_78;
  double local_70;
  double local_68;
  Iterator local_60;
  dgBigVector local_50;
  
  local_8c = material;
  GetOrigin(&local_50,this);
  iVar1 = *(int *)&(this->super_dgRefCounter).field_0xc;
  local_88.super_dgStackBase.m_ptr = malloc((long)(iVar1 << 5));
  local_88.m_size = iVar1;
  if (0 < *(int *)&(this->super_dgRefCounter).field_0xc) {
    local_68 = local_50.super_dgTemplateVector<double>.m_x;
    local_70 = local_50.super_dgTemplateVector<double>.m_y;
    lVar5 = 0x18;
    local_78 = local_50.super_dgTemplateVector<double>.m_z;
    lVar6 = 0;
    do {
      pdVar3 = this->m_points;
      dVar8 = *(double *)((long)pdVar3 + lVar5 + -0x18) - local_68;
      dVar7 = *(double *)((long)pdVar3 + lVar5 + -0x10) - local_70;
      dVar12 = *(double *)((long)pdVar3 + lVar5 + -8) - local_78;
      if ((((0x7fefffffffffffff < (long)ABS(dVar8)) || (0x7fefffffffffffff < (long)ABS(dVar7))) ||
          (0x7fefffffffffffff < (long)ABS(dVar12))) ||
         (0x7fefffffffffffff <
          (*(ulong *)((long)&(pdVar3->super_dgTemplateVector<double>).m_x + lVar5) &
          0x7fffffffffffffff))) {
LAB_0088725e:
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
      }
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar7 * dVar7;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar8;
      auVar9 = vfmadd231sd_fma(auVar9,auVar11,auVar11);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar12;
      auVar9 = vfmadd231sd_fma(auVar9,auVar13,auVar13);
      if (auVar9._0_8_ < 0.0) {
        local_98 = dVar12;
        dVar10 = sqrt(auVar9._0_8_);
        dVar12 = local_98;
      }
      else {
        auVar9 = vsqrtsd_avx(auVar9,auVar9);
        dVar10 = auVar9._0_8_;
      }
      dVar10 = (double)(1.0 / (float)dVar10);
      if (((0x7fefffffffffffff < (long)ABS(dVar8 * dVar10)) ||
          (0x7fefffffffffffff < (long)ABS(dVar7 * dVar10))) ||
         (0x7fefffffffffffff < (long)ABS(dVar12 * dVar10))) goto LAB_0088725e;
      dVar7 = asin(dVar7 * dVar10);
      local_98 = 1.5707999467849731 - (double)(float)dVar7;
      dVar8 = atan2(dVar8 * dVar10,dVar12 * dVar10);
      dVar7 = local_98 / 3.1415998935699463;
      pdVar3 = dgStack<dgBigVector>::operator[](&local_88,(HaI32)lVar6);
      (pdVar3->super_dgTemplateVector<double>).m_x =
           (3.1415998935699463 - (double)(float)dVar8) / 6.283199787139893;
      pdVar3 = dgStack<dgBigVector>::operator[](&local_88,(HaI32)lVar6);
      (pdVar3->super_dgTemplateVector<double>).m_y = dVar7;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar6 < *(int *)&(this->super_dgRefCounter).field_0xc);
  }
  iVar1 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_count;
  local_a8.super_dgStackBase.m_ptr = malloc((long)(iVar1 * 0x60));
  local_a8.m_size = iVar1;
  if (-1 < iVar1) {
    EnumerateAttributeArray(this,(dgVertexAtribute *)local_a8.super_dgStackBase.m_ptr);
    local_60.m_ptr = (dgRedBackNode *)0x0;
    this_00 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head;
    local_60.m_tree = (dgTree<dgEdge,_long> *)this;
    if (this_00 == (dgTreeNode *)0x0) {
      local_60.m_ptr = (dgRedBackNode *)0x0;
    }
    else {
      local_60.m_ptr = dgRedBackNode::Minimum(&this_00->super_dgRedBackNode);
    }
    dVar8 = (double)local_8c;
    while (pdVar2 = local_60.m_ptr, local_60.m_ptr != (dgRedBackNode *)0x0) {
      pdVar4 = dgStack<dgMeshEffect::dgVertexAtribute>::operator[]
                         (&local_a8,*(HaI32 *)&local_60.m_ptr[1].m_left);
      pdVar3 = dgStack<dgBigVector>::operator[](&local_88,*(HaI32 *)&pdVar2[1]._vptr_dgRedBackNode);
      pdVar4->m_u0 = (HaF64)(pdVar3->super_dgTemplateVector<double>).m_x;
      pdVar3 = dgStack<dgBigVector>::operator[](&local_88,*(HaI32 *)&pdVar2[1]._vptr_dgRedBackNode);
      pdVar4->m_v0 = (HaF64)(pdVar3->super_dgTemplateVector<double>).m_y;
      pdVar3 = dgStack<dgBigVector>::operator[](&local_88,*(HaI32 *)&pdVar2[1]._vptr_dgRedBackNode);
      pdVar4->m_u1 = (HaF64)(pdVar3->super_dgTemplateVector<double>).m_x;
      pdVar3 = dgStack<dgBigVector>::operator[](&local_88,*(HaI32 *)&pdVar2[1]._vptr_dgRedBackNode);
      pdVar4->m_v1 = (HaF64)(pdVar3->super_dgTemplateVector<double>).m_y;
      pdVar4->m_material = (HaF64)dVar8;
      dgTree<dgEdge,_long>::Iterator::operator++(&local_60,0);
    }
    if (-1 < local_a8.m_size) {
      FixCylindricalMapping(this,(dgVertexAtribute *)local_a8.super_dgStackBase.m_ptr);
      if (-1 < local_a8.m_size) {
        ApplyAttributeArray(this,(dgVertexAtribute *)local_a8.super_dgStackBase.m_ptr);
        free(local_a8.super_dgStackBase.m_ptr);
        free(local_88.super_dgStackBase.m_ptr);
        return;
      }
    }
  }
  __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,0x60,
                "T &dgStack<dgMeshEffect::dgVertexAtribute>::operator[](hacd::HaI32) [T = dgMeshEffect::dgVertexAtribute]"
               );
}

Assistant:

void dgMeshEffect::SphericalMapping (hacd::HaI32 material)
{
	dgBigVector origin (GetOrigin());

	dgStack<dgBigVector>sphere (m_pointCount);
	for (hacd::HaI32 i = 0; i < m_pointCount; i ++) {
		dgBigVector point (m_points[i] - origin);
		point = point.Scale (1.0f / dgSqrt (point % point));

		hacd::HaF64 u = dgAsin (point.m_y);
		hacd::HaF64 v = dgAtan2 (point.m_x, point.m_z);

		u = (hacd::HaF64 (3.1416f/2.0f) - u) / hacd::HaF64 (3.1416f);
		v = (hacd::HaF64 (3.1416f) - v) / hacd::HaF64 (2.0f * 3.1416f);
		sphere[i].m_x = v;
		sphere[i].m_y = u;
	}


	dgStack<dgVertexAtribute>attribArray (GetCount());
	EnumerateAttributeArray (&attribArray[0]);

	dgPolyhedra::Iterator iter (*this);	
	for(iter.Begin(); iter; iter ++){
		dgEdge* const edge = &(*iter);
		dgVertexAtribute& attrib = attribArray[hacd::HaI32 (edge->m_userData)];
		attrib.m_u0 = sphere[edge->m_incidentVertex].m_x;
		attrib.m_v0 = sphere[edge->m_incidentVertex].m_y;
		attrib.m_u1 = sphere[edge->m_incidentVertex].m_x;
		attrib.m_v1 = sphere[edge->m_incidentVertex].m_y;
		attrib.m_material = material;
	}

	FixCylindricalMapping (&attribArray[0]);
	ApplyAttributeArray (&attribArray[0]);
}